

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  ImGuiViewportP *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow *pIVar5;
  float _y;
  bool local_65;
  ImVec2 local_60;
  bool local_55;
  undefined4 local_54;
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 menu_bar_size;
  ImVec2 menu_bar_pos;
  ImGuiWindow *menu_bar_window;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  ppIVar4 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  pIVar1 = *ppIVar4;
  pIVar5 = FindWindowByName("##MainMenuBar");
  _x = (pIVar2->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((pIVar2->Style).DisplaySafeAreaPadding.y - (pIVar2->Style).FramePadding.y,0.0);
  ImVec2::ImVec2(&menu_bar_pos,_x,_y);
  (pIVar2->NextWindowData).MenuBarOffsetMinVal = menu_bar_pos;
  if ((pIVar5 == (ImGuiWindow *)0x0) || (pIVar5->BeginCount == 0)) {
    menu_bar_size = operator+(&(pIVar1->super_ImGuiViewport).Pos,&pIVar1->CurrWorkOffsetMin);
    ImVec2::ImVec2(&local_40,
                   ((pIVar1->super_ImGuiViewport).Size.x - (pIVar1->CurrWorkOffsetMin).x) +
                   (pIVar1->CurrWorkOffsetMax).x,1.0);
    ImVec2::ImVec2(&local_48,0.0,0.0);
    SetNextWindowPos(&menu_bar_size,0,&local_48);
    SetNextWindowSize(&local_40,0);
  }
  SetNextWindowViewport((pIVar1->super_ImGuiViewport).ID);
  PushStyleVar(2,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,0.0,0.0);
  PushStyleVar(4,(ImVec2 *)&stack0xffffffffffffffb0);
  local_54 = 0x20050f;
  bVar3 = Begin("##MainMenuBar",(bool *)0x0,0x20050f);
  local_65 = false;
  if (bVar3) {
    local_65 = BeginMenuBar();
  }
  local_55 = local_65;
  PopStyleVar(2);
  pIVar5 = GetCurrentWindow();
  if (pIVar5->BeginCount == 1) {
    (pIVar1->CurrWorkOffsetMin).y = (pIVar5->Size).y + (pIVar1->CurrWorkOffsetMin).y;
  }
  ImVec2::ImVec2(&local_60,0.0,0.0);
  (pIVar2->NextWindowData).MenuBarOffsetMinVal = local_60;
  bVar3 = (local_55 & 1U) != 0;
  if (!bVar3) {
    End();
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));    // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}